

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O2

void double_conversion::FillFractionals
               (uint64_t fractionals,int exponent,int fractional_count,Vector<char> buffer,
               int *length,int *decimal_point)

{
  int iVar1;
  int iVar2;
  uint64_t uVar3;
  uint uVar4;
  ulong uVar5;
  int *piVar6;
  int power;
  bool bVar7;
  UInt128 fractionals128;
  
  piVar6 = buffer._8_8_;
  if (exponent < -0x40) {
    fractionals128.low_bits_ = 0;
    fractionals128.high_bits_ = fractionals;
    UInt128::Shift(&fractionals128,-0x40 - exponent);
    iVar1 = 0;
    if (0 < fractional_count) {
      iVar1 = fractional_count;
    }
    power = 0x80;
    while ((iVar1 + power != 0x80 &&
           (fractionals128.high_bits_ != 0 || fractionals128.low_bits_ != 0))) {
      UInt128::Multiply(&fractionals128,5);
      power = power + -1;
      iVar2 = UInt128::DivModPowerOf2(&fractionals128,power);
      buffer.start_[*piVar6] = (char)iVar2 + '0';
      *piVar6 = *piVar6 + 1;
    }
    uVar3 = fractionals128.low_bits_;
    if (0x40 < power) {
      uVar3 = fractionals128.high_bits_;
    }
    if ((uVar3 >> ((ulong)(power + 0xbf) & 0x3f) & 1) != 0) {
      RoundUp(buffer,length,(int *)fractionals128.high_bits_);
    }
  }
  else {
    iVar1 = 0;
    if (0 < fractional_count) {
      iVar1 = fractional_count;
    }
    uVar4 = ~exponent;
    while( true ) {
      bVar7 = iVar1 == 0;
      iVar1 = iVar1 + -1;
      if (bVar7) break;
      if (fractionals == 0) {
        return;
      }
      uVar5 = fractionals * 5 >> ((byte)uVar4 & 0x3f);
      buffer.start_[*piVar6] = (char)uVar5 + '0';
      *piVar6 = *piVar6 + 1;
      fractionals = fractionals * 5 - ((long)(int)uVar5 << ((byte)uVar4 & 0x3f));
      uVar4 = uVar4 - 1;
    }
    if ((fractionals != 0) && ((fractionals >> ((ulong)uVar4 & 0x3f) & 1) != 0)) {
      RoundUp(buffer,length,(int *)(ulong)uVar4);
      return;
    }
  }
  return;
}

Assistant:

static void FillFractionals(uint64_t fractionals, int exponent,
                            int fractional_count, Vector<char> buffer,
                            int* length, int* decimal_point) {
  DOUBLE_CONVERSION_ASSERT(-128 <= exponent && exponent <= 0);
  // 'fractionals' is a fixed-point number, with binary point at bit
  // (-exponent). Inside the function the non-converted remainder of fractionals
  // is a fixed-point number, with binary point at bit 'point'.
  if (-exponent <= 64) {
    // One 64 bit number is sufficient.
    DOUBLE_CONVERSION_ASSERT(fractionals >> 56 == 0);
    int point = -exponent;
    for (int i = 0; i < fractional_count; ++i) {
      if (fractionals == 0) break;
      // Instead of multiplying by 10 we multiply by 5 and adjust the point
      // location. This way the fractionals variable will not overflow.
      // Invariant at the beginning of the loop: fractionals < 2^point.
      // Initially we have: point <= 64 and fractionals < 2^56
      // After each iteration the point is decremented by one.
      // Note that 5^3 = 125 < 128 = 2^7.
      // Therefore three iterations of this loop will not overflow fractionals
      // (even without the subtraction at the end of the loop body). At this
      // time point will satisfy point <= 61 and therefore fractionals < 2^point
      // and any further multiplication of fractionals by 5 will not overflow.
      fractionals *= 5;
      point--;
      int digit = static_cast<int>(fractionals >> point);
      DOUBLE_CONVERSION_ASSERT(digit <= 9);
      buffer[*length] = static_cast<char>('0' + digit);
      (*length)++;
      fractionals -= static_cast<uint64_t>(digit) << point;
    }
    // If the first bit after the point is set we have to round up.
    DOUBLE_CONVERSION_ASSERT(fractionals == 0 || point - 1 >= 0);
    if ((fractionals != 0) && ((fractionals >> (point - 1)) & 1) == 1) {
      RoundUp(buffer, length, decimal_point);
    }
  } else {  // We need 128 bits.
    DOUBLE_CONVERSION_ASSERT(64 < -exponent && -exponent <= 128);
    UInt128 fractionals128 = UInt128(fractionals, 0);
    fractionals128.Shift(-exponent - 64);
    int point = 128;
    for (int i = 0; i < fractional_count; ++i) {
      if (fractionals128.IsZero()) break;
      // As before: instead of multiplying by 10 we multiply by 5 and adjust the
      // point location.
      // This multiplication will not overflow for the same reasons as before.
      fractionals128.Multiply(5);
      point--;
      int digit = fractionals128.DivModPowerOf2(point);
      DOUBLE_CONVERSION_ASSERT(digit <= 9);
      buffer[*length] = static_cast<char>('0' + digit);
      (*length)++;
    }
    if (fractionals128.BitAt(point - 1) == 1) {
      RoundUp(buffer, length, decimal_point);
    }
  }
}